

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.cpp
# Opt level: O3

void (anonymous_namespace)::
     accept_test_case<std::map<std::__cxx11::string,std::vector<ut::test_case*,std::allocator<ut::test_case*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ut::test_case*,std::allocator<ut::test_case*>>>>>>
               (void *map,test_case *i_test)

{
  iterator __position;
  vector<ut::test_case*,std::allocator<ut::test_case*>> *this;
  allocator local_51;
  char *local_50;
  code *local_48;
  test_case *local_40;
  key_type local_38;
  
  local_40 = i_test;
  (**(code **)(*(long *)i_test + 0x10))(&local_50);
  std::__cxx11::string::string((string *)&local_38,local_50,&local_51);
  this = (vector<ut::test_case*,std::allocator<ut::test_case*>> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>_>_>_>
                       *)map,&local_38);
  __position._M_current = *(test_case ***)(this + 8);
  if (__position._M_current == *(test_case ***)(this + 0x10)) {
    std::vector<ut::test_case*,std::allocator<ut::test_case*>>::
    _M_realloc_insert<ut::test_case*const&>(this,__position,&local_40);
  }
  else {
    *__position._M_current = i_test;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (*local_48)(local_50);
  return;
}

Assistant:

void accept_test_case(void *map, ut::test_case *i_test)
	{
		(*static_cast<MapT*>(map))[i_test->fixture_name().c_str()].push_back(i_test);
	}